

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O1

int __thiscall deqp::egl::MultiThreadedTests::init(MultiThreadedTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  MultiThreadedTest *this_00;
  MultiThreadedObjectTest *pMVar1;
  
  this_00 = (MultiThreadedTest *)operator_new(0xd8);
  MultiThreadedTest::MultiThreadedTest
            (this_00,(this->super_TestCaseGroup).m_eglTestCtx,"config","",2,20000000);
  (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultiThreadedTest_003ec230;
  this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x1e0000001e;
  *(undefined4 *)&this_00[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x1e;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer","",1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pixmap","",2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"window","",4);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"single_window","",0xc);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"context","",0x10);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_pixmap","",3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_window","",5);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_single_window","",0xd);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_context","",0x11);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pixmap_window","",6);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pixmap_single_window","",0xe);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pixmap_context","",0x12);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"window_context","",0x14);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"single_window_context","",0x1c);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_pixmap_window","",7);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_pixmap_single_window","",0xf);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_pixmap_context","",0x13);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_window_context","",0x15);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_single_window_context","",0x1d
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pixmap_window_context","",0x16);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pixmap_single_window_context","",0x1e)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_pixmap_window_context","",0x17
            );
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MultiThreadedObjectTest *)operator_new(0x218);
  MultiThreadedObjectTest::MultiThreadedObjectTest
            (pMVar1,(this->super_TestCaseGroup).m_eglTestCtx,"pbuffer_pixmap_single_window_context",
             "",0x1f);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  return extraout_EAX;
}

Assistant:

void MultiThreadedTests::init (void)
{
	// Config tests
	addChild(new MultiThreadedConfigTest(m_eglTestCtx,	"config",	"",	30,	30,	30));

	// Object tests
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer",								"", MultiThreadedObjectTest::TYPE_PBUFFER));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pixmap",								"", MultiThreadedObjectTest::TYPE_PIXMAP));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"window",								"", MultiThreadedObjectTest::TYPE_WINDOW));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"single_window",						"", MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_SINGLE_WINDOW));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"context",								"", MultiThreadedObjectTest::TYPE_CONTEXT));

	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer_pixmap",						"", MultiThreadedObjectTest::TYPE_PBUFFER|MultiThreadedObjectTest::TYPE_PIXMAP));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer_window",						"", MultiThreadedObjectTest::TYPE_PBUFFER|MultiThreadedObjectTest::TYPE_WINDOW));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer_single_window",				"", MultiThreadedObjectTest::TYPE_PBUFFER|MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_SINGLE_WINDOW));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer_context",						"", MultiThreadedObjectTest::TYPE_PBUFFER|MultiThreadedObjectTest::TYPE_CONTEXT));

	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pixmap_window",						"", MultiThreadedObjectTest::TYPE_PIXMAP|MultiThreadedObjectTest::TYPE_WINDOW));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pixmap_single_window",					"", MultiThreadedObjectTest::TYPE_PIXMAP|MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_SINGLE_WINDOW));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pixmap_context",						"", MultiThreadedObjectTest::TYPE_PIXMAP|MultiThreadedObjectTest::TYPE_CONTEXT));

	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"window_context",						"", MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_CONTEXT));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"single_window_context",				"", MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_SINGLE_WINDOW|MultiThreadedObjectTest::TYPE_CONTEXT));

	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer_pixmap_window",				"", MultiThreadedObjectTest::TYPE_PBUFFER|MultiThreadedObjectTest::TYPE_PIXMAP|MultiThreadedObjectTest::TYPE_WINDOW));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer_pixmap_single_window",			"", MultiThreadedObjectTest::TYPE_PBUFFER|MultiThreadedObjectTest::TYPE_PIXMAP|MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_SINGLE_WINDOW));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer_pixmap_context",				"", MultiThreadedObjectTest::TYPE_PBUFFER|MultiThreadedObjectTest::TYPE_PIXMAP|MultiThreadedObjectTest::TYPE_CONTEXT));

	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer_window_context",				"", MultiThreadedObjectTest::TYPE_PBUFFER|MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_CONTEXT));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer_single_window_context",		"", MultiThreadedObjectTest::TYPE_PBUFFER|MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_SINGLE_WINDOW|MultiThreadedObjectTest::TYPE_CONTEXT));

	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pixmap_window_context",				"", MultiThreadedObjectTest::TYPE_PIXMAP|MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_CONTEXT));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pixmap_single_window_context",			"", MultiThreadedObjectTest::TYPE_PIXMAP|MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_SINGLE_WINDOW|MultiThreadedObjectTest::TYPE_CONTEXT));

	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer_pixmap_window_context",		"", MultiThreadedObjectTest::TYPE_PBUFFER|MultiThreadedObjectTest::TYPE_PIXMAP|MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_CONTEXT));
	addChild(new MultiThreadedObjectTest(m_eglTestCtx,	"pbuffer_pixmap_single_window_context",	"", MultiThreadedObjectTest::TYPE_PBUFFER|MultiThreadedObjectTest::TYPE_PIXMAP|MultiThreadedObjectTest::TYPE_WINDOW|MultiThreadedObjectTest::TYPE_SINGLE_WINDOW|MultiThreadedObjectTest::TYPE_CONTEXT));
}